

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

void CheckLength(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  char cVar1;
  bool bVar2;
  Bool BVar3;
  uint code;
  bool bVar4;
  char *pcVar5;
  
  if ((attval == (AttVal *)0x0) || (pcVar5 = attval->value, pcVar5 == (char *)0x0)) {
    code = 0x256;
  }
  else {
    if ((((attval->dict != (Attribute *)0x0) && (node != (Node *)0x0)) &&
        (attval->dict->id == TidyAttr_WIDTH)) &&
       ((node->tag != (Dict *)0x0 && (node->tag->id - TidyTag_COL < 2)))) {
      return;
    }
    BVar3 = prvTidyIsDigit((int)*pcVar5);
    if (BVar3 != no) {
      bVar4 = true;
      do {
        pcVar5 = pcVar5 + 1;
        cVar1 = *pcVar5;
        if (cVar1 == '\0') {
          return;
        }
        bVar2 = (bool)(bVar4 ^ 1);
        bVar4 = (bool)(cVar1 != '%' | bVar2);
      } while ((!bVar4) || ((!bVar2 && (BVar3 = prvTidyIsDigit((int)cVar1), BVar3 != no))));
    }
    code = 0x22b;
  }
  prvTidyReportAttrError(doc,node,attval,code);
  return;
}

Assistant:

void CheckLength( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    tmbstr p;
    
    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    /* don't check for <col width=...> and <colgroup width=...> */
    if (attrIsWIDTH(attval) && (nodeIsCOL(node) || nodeIsCOLGROUP(node)))
        return;

    p = attval->value;
    
    if (!TY_(IsDigit)(*p++))
    {
        TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
    }
    else
    {
        Bool percentFound = no;
        while (*p)
        {
            if (!percentFound && *p == '%')
            {
                percentFound = yes;
            }
            else if (percentFound || !TY_(IsDigit)(*p))
            {
                TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
                break;
            }

            ++p;
        }
    }
}